

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addTag(TranslateToFuzzReader *this)

{
  Module *module;
  Type TVar1;
  Signature SVar2;
  Name NVar3;
  Name name;
  string_view local_48;
  HeapType local_38;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_30;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> tag;
  
  module = this->wasm;
  Name::Name((Name *)&local_48,"tag$");
  NVar3 = Names::getValidTagName(module,(Name)local_48);
  TVar1 = getControlFlowType(this);
  SVar2.results.id = 0;
  SVar2.params.id = TVar1.id;
  ::wasm::HeapType::HeapType(&local_38,SVar2);
  name.super_IString.str._M_str = NVar3.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_30;
  Builder::makeTag(name,(HeapType)NVar3.super_IString.str._M_str);
  ::wasm::Module::addTag((unique_ptr *)this->wasm);
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void TranslateToFuzzReader::addTag() {
  auto tag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                             Signature(getControlFlowType(), Type::none));
  wasm.addTag(std::move(tag));
}